

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O0

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  int in_EDX;
  uint *in_RSI;
  uint *in_RDI;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  int vflag;
  uint32_t mask1;
  uint32_t mask0;
  
  secp256k1_scalar_verify((secp256k1_scalar *)0x104314);
  *in_RDI = *in_RDI & in_EDX - 1U | *in_RSI & (in_EDX - 1U ^ 0xffffffff);
  secp256k1_scalar_verify((secp256k1_scalar *)0x1043b4);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint32_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_CHECKMEM_CHECK_VERIFY(r, sizeof(*r));

    mask0 = vflag + ~((uint32_t)0);
    mask1 = ~mask0;
    *r = (*r & mask0) | (*a & mask1);

    SECP256K1_SCALAR_VERIFY(r);
}